

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::exceptions::invalid_option_syntax::invalid_option_syntax
          (invalid_option_syntax *this,string *text)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_90 [24];
  undefined8 in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  string local_50 [32];
  string local_30 [48];
  
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90;
  std::operator+(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  std::operator+(__lhs,in_RDI);
  std::operator+(__lhs,in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  parsing::parsing((parsing *)in_stack_ffffffffffffff90,(string *)in_stack_ffffffffffffff88);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
  std::__cxx11::string::~string(local_90);
  *(undefined ***)in_RDI = &PTR__invalid_option_syntax_0042f328;
  return;
}

Assistant:

explicit invalid_option_syntax(const std::string& text)
  : parsing("Argument " + LQUOTE + text + RQUOTE +
            " starts with a - but has incorrect syntax")
  {
  }